

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter.cc
# Opt level: O0

Info * re2::Prefilter::Info::Concat(Info *a,Info *b)

{
  byte local_35;
  Info *ab;
  Info *b_local;
  Info *a_local;
  
  a_local = b;
  if (a != (Info *)0x0) {
    if ((a->is_exact_ & 1U) == 0) {
      __assert_fail("a->is_exact_",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prefilter.cc"
                    ,0x130,"static Prefilter::Info *re2::Prefilter::Info::Concat(Info *, Info *)");
    }
    local_35 = 0;
    if (b != (Info *)0x0) {
      local_35 = b->is_exact_;
    }
    if ((local_35 & 1) == 0) {
      __assert_fail("b && b->is_exact_",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prefilter.cc"
                    ,0x131,"static Prefilter::Info *re2::Prefilter::Info::Concat(Info *, Info *)");
    }
    a_local = (Info *)operator_new(0x40);
    Info(a_local);
    CrossProduct(&a->exact_,&b->exact_,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)a_local);
    a_local->is_exact_ = true;
    if (a != (Info *)0x0) {
      ~Info(a);
      operator_delete(a);
    }
    if (b != (Info *)0x0) {
      ~Info(b);
      operator_delete(b);
    }
  }
  return a_local;
}

Assistant:

Prefilter::Info* Prefilter::Info::Concat(Info* a, Info* b) {
  if (a == NULL)
    return b;
  DCHECK(a->is_exact_);
  DCHECK(b && b->is_exact_);
  Info *ab = new Info();

  CrossProduct(a->exact_, b->exact_, &ab->exact_);
  ab->is_exact_ = true;

  delete a;
  delete b;
  return ab;
}